

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void do_reply(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  char buf [4608];
  
  if ((ch->comm[0] & 0x200000) == 0) {
    ch_00 = ch->reply;
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar4 = "They aren\'t here.\n\r";
    }
    else {
      if ((((ch_00->desc == (DESCRIPTOR_DATA *)0x0) && (bVar2 = is_npc(ch_00), !bVar2)) &&
          (bVar2 = is_switched(ch_00), !bVar2)) && (ch_00->pcdata != (PC_DATA *)0x0)) {
        act("$N seems to have lost consciousness...try again later.",ch,(void *)0x0,ch_00,3);
        pcVar4 = pers(ch,ch_00);
        sprintf(buf,"%s tells you \'%s\'\n\r",pcVar4,argument);
        cVar1 = (char)buf._0_4_;
        cVar7 = cVar1 + -0x20;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          cVar7 = cVar1;
        }
        buf[0] = cVar7;
        add_buf(ch_00->pcdata->buffer,buf);
        return;
      }
      bVar2 = is_immortal(ch);
      if ((!bVar2) &&
         ((bVar2 = is_awake(ch_00), !bVar2 || (bVar2 = is_affected(ch_00,(int)gsn_deafen), bVar2))))
      {
        act("$E can\'t hear you.",ch,(void *)0x0,ch_00,3);
        return;
      }
      if ((((ch_00->comm[0] & 3) != 0) && (bVar2 = is_immortal(ch), !bVar2)) &&
         (bVar2 = is_immortal(ch_00), !bVar2)) {
        act_new("$E is not receiving tells.",ch,(void *)0x0,ch_00,3,0);
        return;
      }
      bVar2 = is_immortal(ch_00);
      if ((bVar2) || (bVar2 = is_awake(ch), bVar2)) {
        bVar2 = is_affected(ch,(int)gsn_imprisonvoice);
        if (bVar2) {
          pcVar4 = "Your vocal cords are frozen solid!\n\r";
        }
        else {
          bVar2 = is_affected(ch,(int)gsn_gag);
          if (!bVar2) {
            bVar2 = is_immortal(ch_00);
            if (!bVar2) {
              check_ooc(ch,argument,"TELL");
            }
            bVar2 = is_affected(ch,(int)gsn_deafen);
            if (bVar2) {
              pcVar4 = upstring(argument);
              argument = palloc_string(pcVar4);
            }
            bVar3 = is_immortal(ch);
            if ((!bVar3) || (bVar3 = is_npc(ch_00), bVar3)) {
              pcVar4 = "N";
            }
            else {
              pcVar4 = "F";
            }
            pcVar5 = get_char_color(ch,"tells");
            pcVar6 = END_COLOR(ch);
            sprintf(buf,"You tell $%s \'%s$t%s\'",pcVar4,pcVar5,pcVar6);
            act(buf,ch,argument,ch_00,3);
            bVar3 = is_immortal(ch_00);
            if ((!bVar3) || (bVar3 = is_npc(ch), bVar3)) {
              pcVar4 = "n";
            }
            else {
              pcVar4 = "f";
            }
            pcVar5 = get_char_color(ch_00,"tells");
            pcVar6 = END_COLOR(ch_00);
            sprintf(buf,"$%s tells you \'%s$t%s\'",pcVar4,pcVar5,pcVar6);
            act_new(buf,ch,argument,ch_00,2,0);
            if ((ch_00 != ch) && ((ch_00->progtypes[0] & 0x80U) != 0)) {
              (*(code *)ch_00->pIndexData->mprogs->speech_prog)(ch_00,ch,argument);
            }
            ch_00->reply = ch;
            if (bVar2) {
              free_pstring(argument);
            }
            return;
          }
          pcVar4 = "You are gagged and cannot speak!\n\r";
        }
      }
      else {
        pcVar4 = "In your dreams, or what?\n\r";
      }
    }
  }
  else {
    pcVar4 = "Your message didn\'t get through.\n\r";
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_reply(CHAR_DATA *ch, char *argument)
{
	if (IS_SET(ch->comm, COMM_NOTELL))
	{
		send_to_char("Your message didn't get through.\n\r", ch);
		return;
	}

	auto victim = ch->reply;
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	char buf[MAX_STRING_LENGTH];
	if (victim->desc == nullptr && !is_npc(victim) && !is_switched(victim) && victim->pcdata)
	{
		act("$N seems to have lost consciousness...try again later.", ch, nullptr, victim, TO_CHAR);
		sprintf(buf, "%s tells you '%s'\n\r", pers(ch, victim), argument);
		buf[0] = UPPER(buf[0]);
		add_buf(victim->pcdata->buffer, buf);
		return;
	}

	if (!is_immortal(ch) && (!is_awake(victim) || is_affected(victim, gsn_deafen)))
	{
		act("$E can't hear you.", ch, 0, victim, TO_CHAR);
		return;
	}

	if ((IS_SET(victim->comm, COMM_QUIET) || IS_SET(victim->comm, COMM_DEAF)) && !is_immortal(ch) && !is_immortal(victim))
	{
		act_new("$E is not receiving tells.", ch, 0, victim, TO_CHAR, POS_DEAD);
		return;
	}

	if (!is_immortal(victim) && !is_awake(ch))
	{
		send_to_char("In your dreams, or what?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		send_to_char("You are gagged and cannot speak!\n\r", ch);
		return;
	}

	if (!is_immortal(victim))
		check_ooc(ch, argument, "TELL");

	auto deaf = false;
	if (is_affected(ch, gsn_deafen))
	{
		deaf = true;
		argument = palloc_string(upstring(argument));
	}

	sprintf(buf, "You tell $%s '%s$t%s'",
			is_immortal(ch) && !is_npc(victim) ? "F" : "N",
			get_char_color(ch, "tells"),
			END_COLOR(ch));

	act(buf, ch, argument, victim, TO_CHAR);

	sprintf(buf, "$%s tells you '%s$t%s'",
			is_immortal(victim) && !is_npc(ch) ? "f" : "n",
			get_char_color(victim, "tells"),
			END_COLOR(victim));

	act_new(buf, ch, argument, victim, TO_VICT, POS_DEAD);

	if (IS_SET(victim->progtypes, MPROG_SPEECH) && victim != ch)
		victim->pIndexData->mprogs->speech_prog(victim, ch, argument);

	victim->reply = ch;

	if (deaf)
		free_pstring(argument);
}